

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForOneof
          (Generator *this,OneofDescriptor *oneof)

{
  bool bVar1;
  allocator local_281;
  string local_280;
  string oneof_options;
  string local_240;
  string oneof_name;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_200,*(MessageLite **)(oneof + 0x18));
  OptionsValue(&oneof_options,this,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = std::operator!=(&oneof_options,"None");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_240,"$0.$1[\'$2\']",&local_281);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_280,this,*(Descriptor **)(oneof + 0x10));
    local_200.text_ = local_280._M_dataplus._M_p;
    local_200.size_ = (int)local_280._M_string_length;
    local_50.text_ = "oneofs_by_name";
    local_50.size_ = 0xe;
    local_80.text_ = (char *)**(undefined8 **)(oneof + 8);
    local_80.size_ = *(int *)(*(undefined8 **)(oneof + 8) + 1);
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_170.size_ = -1;
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_1d0.text_ = (char *)0x0;
    local_1d0.size_ = -1;
    strings::Substitute(&oneof_name,&local_240,&local_200,&local_50,&local_80,&local_b0,&local_e0,
                        &local_110,&local_140,&local_170,&local_1a0,&local_1d0);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_240);
    anon_unknown_0::PrintDescriptorOptionsFixingCode(&oneof_name,&oneof_options,this->printer_);
    std::__cxx11::string::~string((string *)&oneof_name);
  }
  std::__cxx11::string::~string((string *)&oneof_options);
  return;
}

Assistant:

void Generator::FixOptionsForOneof(const OneofDescriptor& oneof) const {
  std::string oneof_options = OptionsValue(oneof.options().SerializeAsString());
  if (oneof_options != "None") {
    std::string oneof_name = strings::Substitute(
        "$0.$1['$2']", ModuleLevelDescriptorName(*oneof.containing_type()),
        "oneofs_by_name", oneof.name());
    PrintDescriptorOptionsFixingCode(oneof_name, oneof_options, printer_);
  }
}